

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O2

MacroActualArgumentListSyntax * __thiscall
slang::parsing::Preprocessor::MacroParser::parseActualArgumentList
          (MacroParser *this,Token prevToken)

{
  Preprocessor *this_00;
  BumpAllocator *this_01;
  _Variadic_union<const_slang::syntax::SyntaxNode_*> _Var1;
  SourceLocation SVar2;
  undefined4 extraout_var;
  MacroActualArgumentListSyntax *pMVar3;
  undefined8 extraout_RDX;
  Token *args;
  Token TVar4;
  string_view sVar5;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_138;
  undefined1 local_128;
  Token closeParen;
  Token openParen;
  Token prevToken_local;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> arguments;
  
  prevToken_local.info = prevToken.info;
  prevToken_local._0_8_ = prevToken._0_8_;
  TVar4 = peek(this);
  if (TVar4.kind == OpenParenthesis) {
    openParen = consume(this);
    Token::Token(&closeParen);
    arguments.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
         (pointer)arguments.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement;
    arguments.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len = 0;
    arguments.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 8;
    while( true ) {
      _Var1 = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)parseActualArgument(this);
      local_128 = 1;
      local_138._M_rest = _Var1;
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                (&arguments.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                 (TokenOrSyntax *)&local_138._M_first);
      TVar4 = peek(this);
      if (TVar4.kind != Comma) break;
      local_138._M_first._M_storage = (_Uninitialized<slang::parsing::Token,_true>)consume(this);
      local_128 = 0;
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                (&arguments.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                 (TokenOrSyntax *)&local_138._M_first);
    }
    closeParen = expect(this,CloseParenthesis);
    this_01 = this->pp->alloc;
    local_138._0_4_ =
         SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                   (&arguments.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                    (EVP_PKEY_CTX *)this_01,(EVP_PKEY_CTX *)closeParen.info);
    local_138._M_first._M_storage.rawLen = extraout_var;
    local_138._M_first._M_storage.info = (Info *)extraout_RDX;
    args = &openParen;
    pMVar3 = BumpAllocator::
             emplace<slang::syntax::MacroActualArgumentListSyntax,slang::parsing::Token&,std::span<slang::syntax::TokenOrSyntax,18446744073709551615ul>,slang::parsing::Token&>
                       (this_01,args,
                        (span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)
                        &local_138._M_first,&closeParen);
    SmallVectorBase<slang::syntax::TokenOrSyntax>::cleanup
              (&arguments.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,(EVP_PKEY_CTX *)args);
  }
  else {
    this_00 = this->pp;
    SVar2 = Token::location(&prevToken_local);
    sVar5 = Token::rawText(&prevToken_local);
    addDiag(this_00,(DiagCode)0x50004,(SourceLocation)((long)SVar2 + sVar5._M_len * 0x10000000));
    pMVar3 = (MacroActualArgumentListSyntax *)0x0;
  }
  return pMVar3;
}

Assistant:

MacroActualArgumentListSyntax* Preprocessor::MacroParser::parseActualArgumentList(Token prevToken) {
    // macro has arguments, so we expect to see them here
    if (!peek(TokenKind::OpenParenthesis)) {
        pp.addDiag(diag::ExpectedMacroArgs, prevToken.location() + prevToken.rawText().length());
        return nullptr;
    }

    auto openParen = consume();
    Token closeParen;
    SmallVector<TokenOrSyntax, 8> arguments;
    parseArgumentList(arguments, [this]() { return parseActualArgument(); }, closeParen);

    return pp.alloc.emplace<MacroActualArgumentListSyntax>(openParen, arguments.copy(pp.alloc),
                                                           closeParen);
}